

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_ppi_dlt_check(compiler_state_t *cstate)

{
  slist *psVar1;
  block *local_20;
  block *b;
  slist *s_load_dlt;
  compiler_state_t *cstate_local;
  
  if (cstate->linktype == 0xc0) {
    psVar1 = new_stmt(cstate,0x20);
    (psVar1->s).k = 4;
    local_20 = new_block(cstate,0x15);
    local_20->stmts = psVar1;
    (local_20->s).k = 0x69000000;
  }
  else {
    local_20 = (block *)0x0;
  }
  return local_20;
}

Assistant:

static struct block *
gen_ppi_dlt_check(compiler_state_t *cstate)
{
	struct slist *s_load_dlt;
	struct block *b;

	if (cstate->linktype == DLT_PPI)
	{
		/* Create the statements that check for the DLT
		 */
		s_load_dlt = new_stmt(cstate, BPF_LD|BPF_W|BPF_ABS);
		s_load_dlt->s.k = 4;

		b = new_block(cstate, JMP(BPF_JEQ));

		b->stmts = s_load_dlt;
		b->s.k = SWAPLONG(DLT_IEEE802_11);
	}
	else
	{
		b = NULL;
	}

	return b;
}